

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitset_container_equals(bitset_container_t *container1,bitset_container_t *container2)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  
  iVar3 = container1->cardinality;
  if ((iVar3 != -1) && (container2->cardinality != -1)) {
    if (iVar3 != container2->cardinality) {
      return false;
    }
    if (iVar3 == 0x10000) {
      return true;
    }
  }
  uVar2 = croaring_hardware_support();
  if ((uVar2 & 2) != 0) {
    _Var1 = _avx512_bitset_container_equals(container1,container2);
    return _Var1;
  }
  if ((uVar2 & 1) == 0) {
    iVar3 = bcmp(container1->words,container2->words,0x2000);
    return iVar3 == 0;
  }
  _Var1 = _avx2_bitset_container_equals(container1,container2);
  return _Var1;
}

Assistant:

ALLOW_UNALIGNED
bool bitset_container_equals(const bitset_container_t *container1, const bitset_container_t *container2) {
  if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
    if(container1->cardinality != container2->cardinality) {
      return false;
    }
    if (container1->cardinality == INT32_C(0x10000)) {
      return true;
    }
  }
#if CROARING_IS_X64
  int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
  if( support & ROARING_SUPPORTS_AVX512 ) {
    return _avx512_bitset_container_equals(container1, container2);
  }
  else
#endif
  if( support & ROARING_SUPPORTS_AVX2 ) {
    return _avx2_bitset_container_equals(container1, container2);
  }
#endif
  return memcmp(container1->words,
                container2->words,
                BITSET_CONTAINER_SIZE_IN_WORDS*sizeof(uint64_t)) == 0;
}